

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v)

{
  reference pvVar1;
  allocator<unsigned_long> local_41;
  size_t local_40 [3];
  allocator<unsigned_long> local_21;
  size_t local_20;
  variable *local_18;
  variable *v_local;
  variable_set *this_local;
  
  local_18 = v;
  v_local = (variable *)this;
  local_20 = variable::label(v);
  std::allocator<unsigned_long>::allocator(&local_21);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_v,1,&local_20,&local_21);
  std::allocator<unsigned_long>::~allocator(&local_21);
  local_40[0] = variable::states(local_18);
  std::allocator<unsigned_long>::allocator(&local_41);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_dlocal,1,local_40,&local_41);
  std::allocator<unsigned_long>::~allocator(&local_41);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_dlocal,0)
  ;
  this->m_d = pvVar1;
  return;
}

Assistant:

variable_set(const variable& v) :
			m_v(1, v.label()), m_dlocal(1, v.states()) {
		m_d = &m_dlocal[0];
	}